

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::ubjson::basic_ubjson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
::end_object(basic_ubjson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
             *this,json_visitor *visitor,error_code *ec)

{
  int iVar1;
  basic_json_visitor<char> *in_RDI;
  ser_context *in_stack_ffffffffffffffd8;
  
  *(int *)((long)&in_RDI[1]._vptr_basic_json_visitor + 4) =
       *(int *)((long)&in_RDI[1]._vptr_basic_json_visitor + 4) + -1;
  basic_json_visitor<char>::end_object(in_RDI,in_stack_ffffffffffffffd8,(error_code *)0xde1795);
  *(byte *)&in_RDI[1]._vptr_basic_json_visitor =
       (*(byte *)&in_RDI[2]._vptr_basic_json_visitor ^ 0xff) & 1;
  iVar1 = level((basic_ubjson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
                 *)0xde17a9);
  if (iVar1 == *(int *)((long)&in_RDI[2]._vptr_basic_json_visitor + 4)) {
    *(undefined1 *)&in_RDI[1]._vptr_basic_json_visitor = 0;
  }
  std::vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>::
  pop_back((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_> *)
           0xde17cd);
  return;
}

Assistant:

void end_object(json_visitor& visitor, std::error_code& ec)
    {
        --nesting_depth_;
        visitor.end_object(*this, ec);
        more_ = !cursor_mode_;
        if (level() == mark_level_)
        {
            more_ = false;
        }
        state_stack_.pop_back();
    }